

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBufferMapTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Functional::BufferMapReadCase::iterate(BufferMapReadCase *this)

{
  uint uVar1;
  RenderContext *renderCtx;
  bool bVar2;
  deUint32 dVar3;
  GLenum GVar4;
  deBool dVar5;
  TestLog *log_00;
  char *pcVar6;
  TestLog *log_01;
  deUint8 *pdVar7;
  TestError *this_00;
  deUint8 *refPtr;
  void *ptr;
  deUint32 buf;
  bool isOk;
  BufferWriter local_40;
  BufferWriter writer;
  ReferenceBuffer refBuf;
  deUint32 dataSeed;
  TestLog *log;
  BufferMapReadCase *this_local;
  
  log_00 = tcu::TestContext::getLog
                     ((this->super_BufferCase).super_TestCase.super_TestNode.m_testCtx);
  pcVar6 = tcu::TestNode::getName((TestNode *)this);
  dVar3 = deStringHash(pcVar6);
  deqp::gls::BufferTestUtil::ReferenceBuffer::ReferenceBuffer((ReferenceBuffer *)&writer);
  renderCtx = (this->super_BufferCase).m_renderCtx;
  log_01 = tcu::TestContext::getLog
                     ((this->super_BufferCase).super_TestCase.super_TestNode.m_testCtx);
  deqp::gls::BufferTestUtil::BufferWriter::BufferWriter(&local_40,renderCtx,log_01,this->m_write);
  deqp::gls::BufferTestUtil::ReferenceBuffer::setSize((ReferenceBuffer *)&writer,this->m_bufferSize)
  ;
  pdVar7 = deqp::gls::BufferTestUtil::ReferenceBuffer::getPtr((ReferenceBuffer *)&writer,0);
  deqp::gls::BufferTestUtil::fillWithRandomBytes(pdVar7,this->m_bufferSize,dVar3);
  dVar3 = deqp::gls::BufferTestUtil::BufferCase::genBuffer(&this->super_BufferCase);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_BufferCase).super_CallLogWrapper,this->m_bufferTarget,dVar3);
  glu::CallLogWrapper::glBufferData
            (&(this->super_BufferCase).super_CallLogWrapper,this->m_bufferTarget,
             (long)this->m_bufferSize,(void *)0x0,this->m_usage);
  uVar1 = this->m_bufferSize;
  deqp::gls::BufferTestUtil::ReferenceBuffer::getPtr((ReferenceBuffer *)&writer,0);
  deqp::gls::BufferTestUtil::BufferWriter::write(&local_40,dVar3,(void *)0x0,(ulong)uVar1);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_BufferCase).super_CallLogWrapper,this->m_bufferTarget,dVar3);
  pdVar7 = (deUint8 *)
           glu::CallLogWrapper::glMapBufferRange
                     (&(this->super_BufferCase).super_CallLogWrapper,this->m_bufferTarget,
                      (long)this->m_mapOffset,(long)this->m_mapSize,1);
  GVar4 = glu::CallLogWrapper::glGetError(&(this->super_BufferCase).super_CallLogWrapper);
  glu::checkError(GVar4,"glMapBufferRange",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBufferMapTests.cpp"
                  ,0x53);
  while( true ) {
    dVar5 = ::deGetFalse();
    if ((dVar5 != 0) || (pdVar7 == (deUint8 *)0x0)) break;
    dVar5 = ::deGetFalse();
    if (dVar5 == 0) {
      refPtr = deqp::gls::BufferTestUtil::ReferenceBuffer::getPtr
                         ((ReferenceBuffer *)&writer,this->m_mapOffset);
      bVar2 = deqp::gls::BufferTestUtil::compareByteArrays(log_00,pdVar7,refPtr,this->m_mapSize);
      glu::CallLogWrapper::glUnmapBuffer
                (&(this->super_BufferCase).super_CallLogWrapper,this->m_bufferTarget);
      GVar4 = glu::CallLogWrapper::glGetError(&(this->super_BufferCase).super_CallLogWrapper);
      glu::checkError(GVar4,"glUnmapBuffer",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBufferMapTests.cpp"
                      ,0x59);
      deqp::gls::BufferTestUtil::BufferCase::deleteBuffer(&this->super_BufferCase,dVar3);
      pcVar6 = "Buffer verification failed";
      if (bVar2) {
        pcVar6 = "Pass";
      }
      tcu::TestContext::setTestResult
                ((this->super_BufferCase).super_TestCase.super_TestNode.m_testCtx,
                 (byte)~bVar2 & QP_TEST_RESULT_FAIL,pcVar6);
      deqp::gls::BufferTestUtil::BufferWriter::~BufferWriter(&local_40);
      deqp::gls::BufferTestUtil::ReferenceBuffer::~ReferenceBuffer((ReferenceBuffer *)&writer);
      return STOP;
    }
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,"ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBufferMapTests.cpp"
             ,0x54);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

IterateResult iterate (void)
	{
		TestLog&		log			= m_testCtx.getLog();
		deUint32		dataSeed	= deStringHash(getName());
		ReferenceBuffer	refBuf;
		BufferWriter	writer		(m_renderCtx, m_testCtx.getLog(), m_write);
		bool			isOk		= false;

		// Setup reference data.
		refBuf.setSize(m_bufferSize);
		fillWithRandomBytes(refBuf.getPtr(), m_bufferSize, dataSeed);

		deUint32 buf = genBuffer();
		glBindBuffer(m_bufferTarget, buf);
		glBufferData(m_bufferTarget, m_bufferSize, DE_NULL, m_usage);
		writer.write(buf, 0, m_bufferSize, refBuf.getPtr(), m_bufferTarget);

		glBindBuffer(m_bufferTarget, buf);
		void* ptr = glMapBufferRange(m_bufferTarget, m_mapOffset, m_mapSize, GL_MAP_READ_BIT);
		GLU_CHECK_MSG("glMapBufferRange");
		TCU_CHECK(ptr);

		isOk = compareByteArrays(log, (const deUint8*)ptr, refBuf.getPtr(m_mapOffset), m_mapSize);

		glUnmapBuffer(m_bufferTarget);
		GLU_CHECK_MSG("glUnmapBuffer");

		deleteBuffer(buf);

		m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
								isOk ? "Pass"				: "Buffer verification failed");
		return STOP;
	}